

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.cpp
# Opt level: O2

void __thiscall
benchmarks::BenchmarkSuite::InvokeBenchmark
          (BenchmarkSuite *this,int64_t iterations,ParameterizedBenchmarkId *id,
          IBenchmarksResultsReporterPtr *resultsReporter)

{
  int64_t iterationsCount;
  LoggerWriter *this_00;
  iterator iVar1;
  runtime_error *this_01;
  int64_t iterations_local;
  __shared_ptr<benchmarks::IBenchmarksResultsReporter,_(__gnu_cxx::_Lock_policy)2> local_240;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  MeasureBenchmarkContext ctx;
  
  iterations_local = iterations;
  NamedLogger::Debug((LoggerWriter *)&ctx,(NamedLogger *)s_logger);
  this_00 = NamedLogger::LoggerWriter::operator<<((LoggerWriter *)&ctx,(char (*) [13])0x231cf0);
  NamedLogger::LoggerWriter::operator<<(this_00,&iterations_local);
  NamedLogger::LoggerWriter::~LoggerWriter((LoggerWriter *)&ctx);
  BenchmarkId::BenchmarkId((BenchmarkId *)&ctx,&id->_id);
  iVar1 = std::
          _Rb_tree<benchmarks::BenchmarkId,_std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>,_std::_Select1st<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
          ::find((_Rb_tree<benchmarks::BenchmarkId,_std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>,_std::_Select1st<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
                  *)this,(BenchmarkId *)&ctx);
  BenchmarkId::~BenchmarkId((BenchmarkId *)&ctx);
  iterationsCount = iterations_local;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_benchmarks)._M_t._M_impl.super__Rb_tree_header) {
    std::__shared_ptr<benchmarks::IBenchmarksResultsReporter,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_240,
                 &resultsReporter->
                  super___shared_ptr<benchmarks::IBenchmarksResultsReporter,_(__gnu_cxx::_Lock_policy)2>
                );
    MeasureBenchmarkContext::MeasureBenchmarkContext
              (&ctx,iterationsCount,(IBenchmarksResultsReporterPtr *)&local_240);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_240._M_refcount);
    (**(code **)(**(long **)(iVar1._M_node + 4) + 0x18))
              (*(long **)(iVar1._M_node + 4),&ctx,&id->_params);
    MeasureBenchmarkContext::~MeasureBenchmarkContext(&ctx);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  BenchmarkId::BenchmarkId((BenchmarkId *)&ctx,&id->_id);
  BenchmarkId::ToString_abi_cxx11_(&local_230,(BenchmarkId *)&ctx);
  std::operator+(&local_210,"Benchmark ",&local_230);
  std::operator+(&local_1f0,&local_210," not found!");
  std::runtime_error::runtime_error(this_01,(string *)&local_1f0);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BenchmarkSuite::InvokeBenchmark(int64_t iterations, const ParameterizedBenchmarkId& id, const IBenchmarksResultsReporterPtr& resultsReporter)
	{
		s_logger.Debug() << "iterations: " << iterations;

		auto it = _benchmarks.find(id.GetId());
		if (it == _benchmarks.end())
			throw std::runtime_error("Benchmark " + id.GetId().ToString() + " not found!");

		MeasureBenchmarkContext ctx(iterations, resultsReporter);
		it->second->Perform(ctx, id.GetParams());
	}